

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<6UL,_GF2::MOGrevlex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SPoly(MP<6UL,_GF2::MOGrevlex<6UL>_> *this,size_t i)

{
  bool bVar1;
  WW<6UL> *this_00;
  size_t in_RSI;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_RDI;
  iterator iter;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000040;
  _Self local_20;
  _Self local_18;
  size_t local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                 (&in_RDI->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                   (&in_RDI->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = &std::_List_iterator<GF2::MM<6UL>_>::operator->
                         ((_List_iterator<GF2::MM<6UL>_> *)0x1c68ee)->super_WW<6UL>;
    WW<6UL>::Set(this_00,local_10,true);
    std::_List_iterator<GF2::MM<6UL>_>::operator++(&local_18);
  }
  Normalize(in_stack_00000040);
  return in_RDI;
}

Assistant:

MP& SPoly(size_t i)
	{
		for (iterator iter = begin(); iter != end(); ++iter)
			iter->Set(i, 1);
		Normalize();
		return *this;
	}